

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool anon_unknown.dwarf_18b346a::cmCTestSubdirCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  pointer in_name;
  bool bVar3;
  string fname;
  string cwd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  cmExecutionStatus *local_f8;
  string local_f0;
  char *local_d0;
  size_t local_c8;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  local_f8 = status;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"called with incorrect number of arguments",
               (allocator<char> *)&local_80);
    std::__cxx11::string::_M_assign((string *)&local_f8->Error);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar3 = false;
  }
  else {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    in_name = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar3 = in_name == pbVar1;
      if (bVar3) break;
      local_110 = 0;
      local_108._M_local_buf[0] = '\0';
      local_118 = &local_108;
      bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&local_118);
      }
      else {
        local_b0.View_._M_len = local_c8;
        local_b0.View_._M_str = local_d0;
        local_80.View_._M_len = 1;
        local_80.View_._M_str = local_80.Digits_;
        local_80.Digits_[0] = '/';
        cmStrCat<std::__cxx11::string>(&local_50,&local_b0,&local_80,in_name);
        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if (local_118 == &local_108) {
        local_f0.field_2._8_8_ = local_108._8_8_;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0._M_dataplus._M_p = (pointer)local_118;
      }
      local_f0.field_2._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
      local_f0.field_2._M_local_buf[0] = local_108._M_local_buf[0];
      local_f0._M_string_length = local_110;
      local_110 = 0;
      local_108._M_local_buf[0] = '\0';
      local_118 = &local_108;
      bVar2 = ReadSubdirectory(&local_f0,local_f8);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_118);
      in_name = in_name + 1;
    } while (bVar2);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return bVar3;
}

Assistant:

bool cmCTestSubdirCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  for (std::string const& arg : args) {
    std::string fname;

    if (cmSystemTools::FileIsFullPath(arg)) {
      fname = arg;
    } else {
      fname = cmStrCat(cwd, '/', arg);
    }

    if (!ReadSubdirectory(std::move(fname), status)) {
      return false;
    }
  }
  return true;
}